

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O2

int Str_MuxTryOnce(Gia_Man_t *pNew,Str_Ntk_t *pNtk,Str_Mux_t *pTree,Str_Mux_t *pRoot,int Edge,
                  Vec_Int_t *vDelay,int fVerbose)

{
  Str_Mux_t *pTree_00;
  uint uVar1;
  int iVar2;
  int i;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint k;
  uint uVar6;
  Vec_Int_t *pVVar7;
  uint local_914;
  ulong local_910;
  int nLength;
  Str_Mux_t *local_8e0;
  Vec_Int_t *local_8d8;
  Gia_Man_t *local_8d0;
  Str_Mux_t pBackup [3];
  int pPath [500];
  
  local_8e0 = pTree;
  uVar1 = Str_MuxDelayEdge_rec(pRoot,Edge);
  nLength = 0;
  iVar2 = Str_MuxFindPathEdge_rec(pRoot,Edge,pPath,&nLength);
  iVar4 = nLength;
  if (iVar2 == 0) {
    iVar4 = 0;
  }
  else {
    local_8d8 = vDelay;
    local_8d0 = pNew;
    if (fVerbose != 0) {
      printf("Trying node %d with path of length %d.\n",(ulong)(uint)pRoot->Id,(ulong)(uint)nLength)
      ;
    }
    iVar2 = 0;
    if (0 < iVar4) {
      iVar2 = iVar4;
    }
    local_914 = 0xffffffff;
    uVar6 = 0;
    local_910 = 0;
    uVar5 = uVar1;
    while (i = (int)local_910, i != iVar2) {
      for (k = i + 2; pTree_00 = local_8e0, (int)k < iVar4; k = k + 1) {
        Str_MuxChangeOnce(local_8e0,pPath,i,k,pBackup,(Gia_Man_t *)0x0,(Vec_Int_t *)0x0);
        uVar3 = Str_MuxDelayEdge_rec(pRoot,Edge);
        Str_MuxChangeUndo(pTree_00,pPath,i,k,pBackup);
        if (((int)uVar3 < (int)uVar5) || (uVar5 == uVar3 && 0 < (int)local_914)) {
          local_914 = k | i << 0x10;
          uVar5 = uVar3;
        }
        if (fVerbose != 0) {
          printf("%2d %2d -> %3d (%3d)\n",local_910,(ulong)k,(ulong)uVar3);
        }
        uVar6 = uVar6 + 1;
      }
      local_910 = (ulong)(i + 1);
    }
    if (local_914 == 0xffffffff) {
      iVar4 = 0;
      if (fVerbose != 0) {
        puts("Did not find!");
      }
    }
    else {
      pVVar7 = local_8d8;
      Str_MuxChangeOnce(local_8e0,pPath,(int)local_914 >> 0x10,local_914 & 0xffff,(Str_Mux_t *)0x0,
                        local_8d0,local_8d8);
      iVar4 = 1;
      if (fVerbose != 0) {
        printf("Node %6d (%3d %3d) : Checks = %d. Delay: %d -> %d.\n",(ulong)(uint)pRoot->Id,
               (ulong)(uint)((int)local_914 >> 0x10),(ulong)(local_914 & 0xffff),(ulong)uVar6,
               (ulong)uVar1,CONCAT44((int)((ulong)pVVar7 >> 0x20),uVar5));
        putchar(10);
      }
    }
  }
  return iVar4;
}

Assistant:

int Str_MuxTryOnce( Gia_Man_t * pNew, Str_Ntk_t * pNtk, Str_Mux_t * pTree, Str_Mux_t * pRoot, int Edge, Vec_Int_t * vDelay, int fVerbose )
{
    int pPath[500];
    Str_Mux_t pBackup[3];
    int Delay, DelayBest = Str_MuxDelayEdge_rec( pRoot, Edge ), DelayInit = DelayBest;
    int i, k, nLength = 0, ForkBest = -1, nChecks = 0;
    int RetValue = Str_MuxFindPathEdge_rec( pRoot, Edge, pPath, &nLength );
    if ( RetValue == 0 )
        return 0;
    if ( fVerbose )
        printf( "Trying node %d with path of length %d.\n", pRoot->Id, nLength );
    for ( i = 0; i < nLength; i++ )
    for ( k = i+2; k < nLength; k++ )
    {
        Str_MuxChangeOnce( pTree, pPath, i, k, pBackup, NULL, NULL );
        Delay = Str_MuxDelayEdge_rec( pRoot, Edge );
        Str_MuxChangeUndo( pTree, pPath, i, k, pBackup );
        if ( DelayBest > Delay || (ForkBest > 0 && DelayBest == Delay) )
            DelayBest = Delay, ForkBest = (i << 16) | k;
        if ( fVerbose )
            printf( "%2d %2d -> %3d (%3d)\n", i, k, Delay, DelayBest );
        nChecks++;
    }
    if ( ForkBest == -1 )
    {
        if ( fVerbose )
            printf( "Did not find!\n" );
        return 0;
    }
//    Str_MuxDelayPrint_rec( pRoot, Edge ); printf( "\n" );
    Str_MuxChangeOnce( pTree, pPath, ForkBest >> 16, ForkBest & 0xFFFF, NULL, pNew, vDelay );
//    Str_MuxDelayPrint_rec( pRoot, Edge ); printf( "\n" );
    if ( fVerbose )
        printf( "Node %6d (%3d %3d) : Checks = %d. Delay: %d -> %d.\n", 
            pRoot->Id, ForkBest >> 16, ForkBest & 0xFFFF, nChecks, DelayInit, DelayBest );
    if ( fVerbose )
        printf( "\n" );
    return 1;
}